

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

bool __thiscall
cmCommandArgumentParserHelper::HandleEscapeSymbol
          (cmCommandArgumentParserHelper *this,ParserType *pt,char symbol)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  undefined7 in_register_00000011;
  char *str;
  char symbol_local;
  string local_1b0;
  ostringstream e;
  
  iVar1 = (int)CONCAT71(in_register_00000011,symbol);
  uVar2 = (ulong)(iVar1 - 0x20U);
  symbol_local = symbol;
  if (iVar1 - 0x20U < 0x3f) {
    if ((0x500000010000031dU >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 != 0x10) {
        if (uVar2 == 0x1b) {
          str = "\\;";
          iVar1 = 2;
          goto LAB_002dad71;
        }
        goto LAB_002dada0;
      }
      str = "";
    }
    else {
      str = &symbol_local;
    }
  }
  else {
LAB_002dada0:
    if (iVar1 == 0x6e) {
      str = "\n";
    }
    else if (iVar1 == 0x72) {
      str = "\r";
    }
    else {
      if (iVar1 != 0x74) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar3 = std::operator<<((ostream *)&e,"Invalid escape sequence \\");
        std::operator<<(poVar3,symbol);
        std::__cxx11::stringbuf::str();
        SetError(this,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return false;
      }
      str = "\t";
    }
  }
  iVar1 = 1;
LAB_002dad71:
  AllocateParserType(this,pt,str,iVar1);
  return true;
}

Assistant:

bool cmCommandArgumentParserHelper::HandleEscapeSymbol(
  cmCommandArgumentParserHelper::ParserType* pt, char symbol)
{
  switch (symbol) {
    case '\\':
    case '"':
    case ' ':
    case '#':
    case '(':
    case ')':
    case '$':
    case '@':
    case '^':
      this->AllocateParserType(pt, &symbol, 1);
      break;
    case ';':
      this->AllocateParserType(pt, "\\;", 2);
      break;
    case 't':
      this->AllocateParserType(pt, "\t", 1);
      break;
    case 'n':
      this->AllocateParserType(pt, "\n", 1);
      break;
    case 'r':
      this->AllocateParserType(pt, "\r", 1);
      break;
    case '0':
      this->AllocateParserType(pt, "\0", 1);
      break;
    default: {
      std::ostringstream e;
      e << "Invalid escape sequence \\" << symbol;
      this->SetError(e.str());
    }
      return false;
  }
  return true;
}